

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_remove_rangeBeyondBounds_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1221fe;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"0123456789",0xb);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x122244;
  AString_remove(&string,5,100);
  if (string.capacity != 0x10) {
    iVar1 = 0x1c4;
LAB_0012254c:
    local_60 = "(16)";
    pcVar8 = "(string).capacity";
    pcVar7 = "(string).capacity == (16)";
    local_58 = (char *)0x10;
    pcVar4 = (char *)string.capacity;
LAB_00122629:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_0012262b;
  }
  uStack_50 = 0x122263;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x1c4);
  if (string.buffer == (char *)0x0) {
    ppcVar6 = &local_58;
    pcVar4 = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar8 = "(void*) (string).buffer";
    iVar1 = 0x1c4;
    goto LAB_00122676;
  }
  uStack_50 = 0x122280;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x1c4);
  pcVar3 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar3 = "(null)";
LAB_00122458:
    local_60 = "01234";
    pcStack_70 = "(\"01234\")";
    pcVar7 = "(string).buffer == (\"01234\")";
    iVar1 = 0x1c4;
  }
  else {
    uStack_50 = 0x12229d;
    iVar1 = strcmp("01234",string.buffer);
    if (iVar1 != 0) {
      pcVar4 = "\"";
      goto LAB_00122458;
    }
    uStack_50 = 0x1222b6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c4);
    if (string.size != 5) {
      local_60 = "strlen(\"01234\")";
      pcVar7 = "(string).size == strlen(\"01234\")";
      pcVar8 = "(string).size";
      iVar1 = 0x1c4;
      local_58 = (char *)0x5;
      pcVar4 = (char *)string.size;
      goto LAB_00122629;
    }
    uStack_50 = 0x1222d6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c4);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar6 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount";
      iVar1 = 0x1c5;
LAB_00122676:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar6 + -8) = test_AString_remove_zeroRange_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar4,pcVar3,pcVar7,pcVar8);
    }
    uStack_50 = 0x1222f7;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c5);
    uStack_50 = 0x12230e;
    AString_remove(&string,2,0xffffffffffffffff);
    if (string.capacity != 0x10) {
      iVar1 = 0x1c7;
      goto LAB_0012254c;
    }
    uStack_50 = 0x12232d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c7);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar8 = "(void*) (string).buffer";
      iVar1 = 0x1c7;
      goto LAB_00122676;
    }
    uStack_50 = 0x12234a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c7);
    pcVar3 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar3 = "(null)";
      pcVar4 = "";
    }
    else {
      uStack_50 = 0x122367;
      iVar1 = strcmp("01",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x122380;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x1c7);
        if (string.size == 2) {
          uStack_50 = 0x1223a0;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c7);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x1223c1;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x1c8);
            uStack_50 = 0x1223ca;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar6 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount";
          iVar1 = 0x1c8;
          goto LAB_00122676;
        }
        local_60 = "strlen(\"01\")";
        pcVar7 = "(string).size == strlen(\"01\")";
        pcVar8 = "(string).size";
        iVar1 = 0x1c7;
        local_58 = (char *)0x2;
        pcVar4 = (char *)string.size;
        goto LAB_00122629;
      }
      pcVar4 = "\"";
    }
    local_60 = "01";
    pcStack_70 = "(\"01\")";
    pcVar7 = "(string).buffer == (\"01\")";
    iVar1 = 0x1c7;
  }
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar3;
  pcStack_78 = pcVar4;
LAB_0012262b:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x122632;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar2,pcVar7,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_remove_rangeBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("0123456789", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_remove(&string, 5, 100);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    AString_remove(&string, 2, -1);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}